

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ConfigBlockSymbol::registerRules(ConfigBlockSymbol *this,InstanceOverride *node)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  ConfigRule *pCVar4;
  value_type_pointer ppVar5;
  int iVar6;
  undefined1 auVar7 [16];
  ushort uVar8;
  ulong pos0;
  char_pointer puVar9;
  ulong uVar10;
  char_pointer puVar11;
  ulong hash;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  table_element_pointer ppVar15;
  char_pointer puVar16;
  uchar uVar17;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  iterator iVar24;
  locator res;
  try_emplace_args_t local_71;
  flat_hash_map<const_syntax::SyntaxNode_*,_const_ConfigRule_*> *local_70;
  SyntaxNode *local_68;
  ulong local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  pCVar4 = node->rule;
  if (pCVar4 != (ConfigRule *)0x0) {
    local_70 = &this->ruleBySyntax;
    local_68 = (pCVar4->syntax).ptr;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_68;
    hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->ruleBySyntax).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                          .arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar5 = (this->ruleBySyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
             .arrays.elements_;
    local_60 = (this->ruleBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
               .arrays.groups_size_mask;
    uVar10 = 0;
    uVar14 = pos0;
    do {
      pgVar2 = (this->ruleBySyntax).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
               .arrays.groups_ + uVar14;
      local_58 = pgVar2->m[0].n;
      uStack_57 = pgVar2->m[1].n;
      uStack_56 = pgVar2->m[2].n;
      bStack_55 = pgVar2->m[3].n;
      uStack_54 = pgVar2->m[4].n;
      uStack_53 = pgVar2->m[5].n;
      uStack_52 = pgVar2->m[6].n;
      bStack_51 = pgVar2->m[7].n;
      uStack_50 = pgVar2->m[8].n;
      uStack_4f = pgVar2->m[9].n;
      uStack_4e = pgVar2->m[10].n;
      bStack_4d = pgVar2->m[0xb].n;
      uStack_4c = pgVar2->m[0xc].n;
      uStack_4b = pgVar2->m[0xd].n;
      uStack_4a = pgVar2->m[0xe].n;
      bStack_49 = pgVar2->m[0xf].n;
      uVar17 = (uchar)uVar3;
      auVar23[0] = -(local_58 == uVar17);
      uVar20 = (uchar)((uint)uVar3 >> 8);
      auVar23[1] = -(uStack_57 == uVar20);
      uVar21 = (uchar)((uint)uVar3 >> 0x10);
      auVar23[2] = -(uStack_56 == uVar21);
      bVar22 = (byte)((uint)uVar3 >> 0x18);
      auVar23[3] = -(bStack_55 == bVar22);
      auVar23[4] = -(uStack_54 == uVar17);
      auVar23[5] = -(uStack_53 == uVar20);
      auVar23[6] = -(uStack_52 == uVar21);
      auVar23[7] = -(bStack_51 == bVar22);
      auVar23[8] = -(uStack_50 == uVar17);
      auVar23[9] = -(uStack_4f == uVar20);
      auVar23[10] = -(uStack_4e == uVar21);
      auVar23[0xb] = -(bStack_4d == bVar22);
      auVar23[0xc] = -(uStack_4c == uVar17);
      auVar23[0xd] = -(uStack_4b == uVar20);
      auVar23[0xe] = -(uStack_4a == uVar21);
      auVar23[0xf] = -(bStack_49 == bVar22);
      for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
          uVar12 = uVar12 - 1 & uVar12) {
        iVar6 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        if (local_68 ==
            *(SyntaxNode **)((long)&ppVar5[uVar14 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
          local_48.p = (pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>
                        *)((long)&ppVar5[uVar14 * 0xf].first + (ulong)(uint)(iVar6 << 4));
          goto LAB_0014618a;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
      lVar13 = uVar14 + uVar10;
      uVar10 = uVar10 + 1;
      uVar14 = lVar13 + 1U & local_60;
    } while (uVar10 <= local_60);
    if ((this->ruleBySyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
        .size_ctrl.size <
        (this->ruleBySyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                  *)local_70,(arrays_type *)local_70,pos0,hash,&local_71,&local_68);
      psVar1 = &(this->ruleBySyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigRule_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigRule_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigRule_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigRule_const*>>>
                  *)local_70,hash,&local_71,&local_68);
    }
LAB_0014618a:
    (local_48.p)->second = pCVar4;
  }
  iVar24 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    *)node);
  if (iVar24.p_ == (table_element_pointer)0x0) {
    return;
  }
LAB_001461aa:
  do {
    registerRules(this,&(iVar24.p_)->second);
    puVar11 = iVar24.pc_ + 0x12;
    puVar16 = iVar24.pc_ + 2;
    while( true ) {
      puVar9 = puVar16;
      puVar16 = iVar24.pc_;
      ppVar15 = iVar24.p_ + 1;
      if (((uint)iVar24.pc_ & 0xf) == 0xe) break;
      iVar24.p_ = ppVar15;
      iVar24.pc_ = puVar16 + 1;
      puVar11 = puVar11 + 1;
      puVar16 = puVar9 + 1;
      if (puVar9[-1] != '\0') goto code_r0x001461e5;
    }
    auVar18[0] = -(*puVar9 == '\0');
    auVar18[1] = -(puVar9[1] == '\0');
    auVar18[2] = -(puVar9[2] == '\0');
    auVar18[3] = -(puVar9[3] == '\0');
    auVar18[4] = -(puVar9[4] == '\0');
    auVar18[5] = -(puVar9[5] == '\0');
    auVar18[6] = -(puVar9[6] == '\0');
    auVar18[7] = -(puVar9[7] == '\0');
    auVar18[8] = -(puVar9[8] == '\0');
    auVar18[9] = -(puVar9[9] == '\0');
    auVar18[10] = -(puVar9[10] == '\0');
    auVar18[0xb] = -(puVar9[0xb] == '\0');
    auVar18[0xc] = -(puVar9[0xc] == '\0');
    auVar18[0xd] = -(puVar9[0xd] == '\0');
    auVar18[0xe] = -(puVar9[0xe] == '\0');
    auVar18[0xf] = -(puVar9[0xf] == '\0');
    uVar8 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe;
    while (uVar8 == 0x7fff) {
      ppVar15 = ppVar15 + 0xf;
      auVar19[0] = -(*puVar11 == '\0');
      auVar19[1] = -(puVar11[1] == '\0');
      auVar19[2] = -(puVar11[2] == '\0');
      auVar19[3] = -(puVar11[3] == '\0');
      auVar19[4] = -(puVar11[4] == '\0');
      auVar19[5] = -(puVar11[5] == '\0');
      auVar19[6] = -(puVar11[6] == '\0');
      auVar19[7] = -(puVar11[7] == '\0');
      auVar19[8] = -(puVar11[8] == '\0');
      auVar19[9] = -(puVar11[9] == '\0');
      auVar19[10] = -(puVar11[10] == '\0');
      auVar19[0xb] = -(puVar11[0xb] == '\0');
      auVar19[0xc] = -(puVar11[0xc] == '\0');
      auVar19[0xd] = -(puVar11[0xd] == '\0');
      auVar19[0xe] = -(puVar11[0xe] == '\0');
      auVar19[0xf] = -(puVar11[0xf] == '\0');
      puVar9 = puVar11;
      puVar11 = puVar11 + 0x10;
      uVar8 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe;
    }
    uVar12 = 0;
    if ((uVar8 ^ 0x7fff) != 0) {
      for (; ((uVar8 ^ 0x7fff) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    if (puVar9[uVar12] == '\x01') {
      return;
    }
    iVar24.p_ = ppVar15 + uVar12;
    iVar24.pc_ = puVar9 + uVar12;
  } while( true );
code_r0x001461e5:
  if (puVar9[-1] == '\x01') {
    return;
  }
  iVar24.pc_ = puVar9 + -1;
  goto LAB_001461aa;
}

Assistant:

void ConfigBlockSymbol::registerRules(const InstanceOverride& node) const {
    if (node.rule)
        ruleBySyntax[node.rule->syntax] = node.rule;

    for (auto& [_, child] : node.childNodes)
        registerRules(child);
}